

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

bool __thiscall cfd::core::Script::IsP2pkhScript(Script *this)

{
  pointer pSVar1;
  size_t sVar2;
  bool bVar3;
  
  sVar2 = ByteData::GetDataSize(&this->script_data_);
  if ((((sVar2 == 0x19) &&
       (pSVar1 = (this->script_stack_).
                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (long)(this->script_stack_).
             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 == 0x1e0)) &&
      ((pSVar1->op_code_).data_type_ == ScriptOperator::OP_DUP._8_4_)) &&
     (((pSVar1[1].op_code_.data_type_ == ScriptOperator::OP_HASH160._8_4_ &&
       (pSVar1[2].type_ == kElementBinary)) &&
      (pSVar1[3].op_code_.data_type_ == ScriptOperator::OP_EQUALVERIFY._8_4_)))) {
    bVar3 = pSVar1[4].op_code_.data_type_ == ScriptOperator::OP_CHECKSIG._8_4_;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Script::IsP2pkhScript() const {
  return (
      script_data_.GetDataSize() == kScriptHashP2pkhLength &&
      script_stack_.size() == 5 &&
      script_stack_[0].GetOpCode() == ScriptOperator::OP_DUP &&
      script_stack_[1].GetOpCode() == ScriptOperator::OP_HASH160 &&
      script_stack_[2].IsBinary() &&
      script_stack_[3].GetOpCode() == ScriptOperator::OP_EQUALVERIFY &&
      script_stack_[4].GetOpCode() == ScriptOperator::OP_CHECKSIG);
}